

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

void __thiscall wasm::IRBuilder::push(IRBuilder *this,Expression *expr)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  mapped_type mVar5;
  bool bVar6;
  mapped_type *pmVar7;
  BasicType local_24;
  ScopeCtx *local_20;
  ScopeCtx *scope;
  Expression *expr_local;
  IRBuilder *this_local;
  
  scope = (ScopeCtx *)expr;
  expr_local = (Expression *)this;
  local_20 = getScope(this);
  local_24 = unreachable;
  bVar6 = wasm::Type::operator==
                    ((Type *)((long)&(scope->scope).
                                     super__Variant_base<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                                     .
                                     super__Move_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                                     .
                                     super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                                     .
                                     super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                                     .
                                     super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                                     .
                                     super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                             + 8),&local_24);
  if (bVar6) {
    local_20->unreachable = true;
  }
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
            (&local_20->exprStack,(value_type *)&scope);
  applyDebugLoc(this,(Expression *)scope);
  if (((this->binaryPos != (size_t *)0x0) && (this->func != (Function *)0x0)) &&
     (this->lastBinaryPos != *this->binaryPos)) {
    sVar1 = this->lastBinaryPos;
    sVar2 = this->codeSectionOffset;
    sVar3 = *this->binaryPos;
    sVar4 = this->codeSectionOffset;
    pmVar7 = std::
             unordered_map<wasm::Expression_*,_wasm::BinaryLocations::Span,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>_>
             ::operator[](&this->func->expressionLocations,(key_type *)&scope);
    mVar5.end = (int)sVar3 - (int)sVar4;
    mVar5.start = (int)sVar1 - (int)sVar2;
    *pmVar7 = mVar5;
    this->lastBinaryPos = *this->binaryPos;
  }
  return;
}

Assistant:

void IRBuilder::push(Expression* expr) {
  auto& scope = getScope();
  if (expr->type == Type::unreachable) {
    scope.unreachable = true;
  }
  scope.exprStack.push_back(expr);

  applyDebugLoc(expr);
  if (binaryPos && func && lastBinaryPos != *binaryPos) {
    func->expressionLocations[expr] =
      BinaryLocations::Span{BinaryLocation(lastBinaryPos - codeSectionOffset),
                            BinaryLocation(*binaryPos - codeSectionOffset)};
    lastBinaryPos = *binaryPos;
  }

  DBG(std::cerr << "After pushing " << ShallowExpression{expr} << ":\n");
  DBG(dump());
}